

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O1

int fits_hcompress(int *a,int ny,int nx,int scale,char *output,long *nbytes,int *status)

{
  long lVar1;
  byte bVar2;
  int *piVar3;
  void *__src;
  sbyte sVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  undefined4 in_register_0000000c;
  char cVar8;
  undefined4 in_register_00000014;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  char *err_message;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  int *piVar27;
  long *plVar28;
  int ny2;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  double dVar36;
  int vmax [3];
  undefined2 local_eb;
  byte local_e9;
  int *local_e8;
  ulong local_e0;
  char *local_d8;
  int local_d0;
  undefined4 local_cc;
  uint local_c8 [4];
  int local_b8;
  uint local_b4;
  ulong local_b0;
  int *local_a8;
  uint local_9c;
  int local_98;
  int local_94;
  ulong local_90;
  long *local_88;
  int local_7c;
  int local_78;
  uint local_74;
  long local_70;
  int *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_b0 = CONCAT44(in_register_00000014,nx);
  local_58 = CONCAT44(in_register_0000000c,scale);
  if (0 < *status) {
    return *status;
  }
  uVar34 = (ulong)(uint)ny;
  iVar26 = ny;
  if (ny < nx) {
    iVar26 = nx;
  }
  local_e8 = a;
  local_d8 = output;
  dVar36 = log((double)iVar26);
  iVar29 = (int)(dVar36 / 0.6931471805599453 + 0.5);
  piVar3 = (int *)malloc((long)((iVar26 - (iVar26 + 1 >> 0x1f)) + 1 >> 1) << 2);
  local_e0 = uVar34;
  local_a8 = piVar3;
  local_88 = nbytes;
  if (piVar3 == (int *)0x0) {
    ffpmsg("htrans: insufficient memory");
    iVar26 = 0x19d;
    piVar3 = local_a8;
  }
  else {
    iVar29 = (uint)(1 << ((byte)iVar29 & 0x1f) < iVar26) + iVar29;
    if (0 < iVar29) {
      local_48 = (ulong)(uint)(ny * 2);
      local_68 = local_e8 + 1;
      local_70 = (long)ny << 2;
      local_60 = 0xfffffffe;
      uVar14 = 0xfffffffc;
      uVar9 = 2;
      iVar26 = 1;
      local_90 = 1;
      uVar32 = 0;
      iVar13 = 0;
      uVar33 = local_b0 & 0xffffffff;
      local_7c = iVar29;
      local_50 = uVar34;
      do {
        lVar1 = local_70;
        local_b4 = (uint)uVar33;
        local_9c = (int)(uVar33 >> 0x1f) + local_b4 & 0xfffffffe;
        iVar19 = (int)uVar34;
        local_d0 = iVar19 - ((int)(uVar34 >> 0x1f) + iVar19 & 0xfffffffeU);
        iVar30 = 0;
        uVar17 = (uint)local_60;
        bVar2 = (byte)uVar32;
        iVar18 = (int)local_90;
        iVar29 = (int)local_e0;
        iVar15 = (int)uVar9;
        if (0 < (int)local_9c) {
          local_94 = iVar19 - local_d0;
          local_74 = uVar32 ^ 1;
          lVar16 = 0;
          iVar30 = 0;
          uVar11 = local_50;
          do {
            if (local_94 < 1) {
              iVar24 = iVar30 * iVar29;
              iVar6 = iVar29 + iVar24;
            }
            else {
              iVar6 = (int)uVar11;
              iVar12 = (int)lVar16;
              lVar25 = 0;
              do {
                iVar24 = local_68[(long)iVar6 + lVar25 + -1] + local_68[iVar6 + lVar25];
                iVar7 = local_68[(long)iVar12 + lVar25 + -1];
                iVar22 = local_68[iVar12 + lVar25];
                iVar23 = iVar22 + iVar7 + iVar24 >> bVar2;
                iVar31 = iVar24 - (iVar22 + iVar7) >> bVar2;
                iVar21 = local_68[iVar6 + lVar25] - local_68[(long)iVar6 + lVar25 + -1];
                iVar10 = (iVar21 + iVar22) - iVar7 >> bVar2;
                iVar24 = iVar18;
                if (iVar31 < 0) {
                  iVar24 = 0;
                }
                local_68[iVar6 + lVar25] = (iVar21 - iVar22) + iVar7 >> bVar2;
                local_68[(long)iVar6 + lVar25 + -1] = iVar24 + iVar31 & uVar17;
                iVar24 = iVar18;
                if (iVar10 < 0) {
                  iVar24 = 0;
                }
                local_68[iVar12 + lVar25] = iVar24 + iVar10 & uVar17;
                iVar24 = iVar15;
                if (iVar23 < 0) {
                  iVar24 = iVar26;
                }
                local_68[(long)iVar12 + lVar25 + -1] = iVar24 + iVar23 & uVar14;
                lVar25 = lVar25 + 2;
                iVar24 = (int)lVar25;
              } while (iVar24 < local_94);
              iVar6 = iVar24 + iVar6;
              iVar24 = iVar24 + iVar12;
              piVar3 = local_a8;
              local_cc = iVar30;
              local_40 = uVar11;
              local_38 = lVar16;
            }
            if (local_d0 != 0) {
              iVar12 = local_e8[iVar24] + local_e8[iVar6];
              sVar4 = (sbyte)local_74;
              iVar22 = local_e8[iVar6] - local_e8[iVar24];
              iVar7 = iVar18;
              if (iVar22 << sVar4 < 0) {
                iVar7 = 0;
              }
              iVar10 = iVar15;
              if (iVar12 << sVar4 < 0) {
                iVar10 = iVar26;
              }
              local_e8[iVar6] = iVar7 + (iVar22 << sVar4) & uVar17;
              local_e8[iVar24] = iVar10 + (iVar12 << sVar4) & uVar14;
              piVar3 = local_a8;
            }
            iVar30 = iVar30 + 2;
            lVar16 = lVar16 + local_48;
            uVar11 = uVar11 + local_48;
            local_98 = iVar26;
          } while (iVar30 < (int)local_9c);
        }
        if (local_b4 != local_9c) {
          local_cc = iVar30 * iVar29;
          if (local_d0 < iVar19) {
            bVar5 = bVar2 ^ 1;
            lVar16 = 0;
            do {
              iVar30 = local_68[(long)local_cc + lVar16 + -1] + local_68[local_cc + lVar16];
              iVar24 = local_68[local_cc + lVar16] - local_68[(long)local_cc + lVar16 + -1];
              iVar6 = iVar18;
              if (iVar24 << bVar5 < 0) {
                iVar6 = 0;
              }
              local_68[local_cc + lVar16] = iVar6 + (iVar24 << bVar5) & uVar17;
              iVar6 = iVar15;
              if (iVar30 << bVar5 < 0) {
                iVar6 = iVar26;
              }
              local_68[(long)local_cc + lVar16 + -1] = iVar6 + (iVar30 << bVar5) & uVar14;
              lVar16 = lVar16 + 2;
            } while ((int)lVar16 < iVar19 - local_d0);
            local_cc = local_cc + (int)lVar16;
            piVar3 = local_a8;
          }
          if (local_d0 != 0) {
            bVar2 = 2 - bVar2 & 0x1f;
            if (-1 < local_e8[local_cc] << bVar2) {
              iVar26 = iVar15;
            }
            local_e8[local_cc] = iVar26 + (local_e8[local_cc] << bVar2) & uVar14;
          }
        }
        piVar27 = local_e8;
        local_b8 = iVar19;
        local_90 = uVar9;
        local_78 = iVar13;
        local_60 = (ulong)uVar14;
        if (0 < (int)local_b4) {
          do {
            shuffle(piVar27,iVar19,1,piVar3);
            uVar33 = uVar33 - 1;
            piVar27 = (int *)((long)piVar27 + lVar1);
          } while (uVar33 != 0);
        }
        uVar14 = local_b4;
        piVar27 = local_e8;
        if (0 < iVar19) {
          do {
            shuffle(piVar27,uVar14,iVar29,piVar3);
            uVar34 = uVar34 - 1;
            piVar27 = piVar27 + 1;
          } while (uVar34 != 0);
        }
        uVar33 = (ulong)(uint)((int)(uVar14 + 1) >> 1);
        uVar34 = (ulong)(uint)(iVar19 + 1 >> 1);
        uVar14 = (int)local_60 * 2;
        uVar9 = (ulong)(uint)((int)local_90 * 2);
        iVar26 = (int)local_90 * 2 + -1;
        iVar13 = local_78 + 1;
        uVar32 = 1;
      } while (iVar13 != local_7c);
    }
    free(piVar3);
    iVar26 = 0;
    nbytes = local_88;
  }
  if (piVar3 == (int *)0x0) goto LAB_001c3537;
  iVar26 = (int)local_58;
  if ((1 < iVar26) && (local_e8 <= local_e8 + (long)((int)local_b0 * (int)local_e0) + -1)) {
    uVar14 = iVar26 + 1U >> 1;
    piVar3 = local_e8;
    do {
      iVar29 = 1 - uVar14;
      if (0 < *piVar3) {
        iVar29 = uVar14 - 1;
      }
      *piVar3 = (iVar29 + *piVar3) / iVar26;
      piVar3 = piVar3 + 1;
    } while (piVar3 <= local_e8 + (long)((int)local_b0 * (int)local_e0) + -1);
  }
  lVar1 = *nbytes;
  noutmax = lVar1;
  *nbytes = 0;
  noutchar = 0;
  if (1 < lVar1) {
    local_d8[0] = -0x23;
    local_d8[1] = -0x67;
    noutchar = 2;
  }
  uVar14 = (int)local_b0 * (int)local_e0;
  lVar16 = 4;
  uVar34 = local_b0;
  do {
    *(char *)((long)&local_cc + lVar16 + 3) = (char)uVar34;
    uVar34 = (ulong)(uint)((int)uVar34 >> 8);
    lVar16 = lVar16 + -1;
  } while (lVar16 != 0);
  lVar25 = 0;
  lVar16 = noutchar;
  do {
    if (lVar16 < lVar1) {
      local_d8[lVar16] = *(char *)((long)local_c8 + lVar25);
      lVar16 = lVar16 + 1;
      noutchar = lVar16;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 4);
  lVar16 = 4;
  uVar34 = local_e0;
  do {
    *(char *)((long)&local_cc + lVar16 + 3) = (char)uVar34;
    uVar34 = (ulong)(uint)((int)uVar34 >> 8);
    lVar16 = lVar16 + -1;
  } while (lVar16 != 0);
  lVar25 = 0;
  lVar16 = noutchar;
  do {
    if (lVar16 < lVar1) {
      local_d8[lVar16] = *(char *)((long)local_c8 + lVar25);
      lVar16 = lVar16 + 1;
      noutchar = lVar16;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 4);
  lVar16 = 4;
  uVar34 = local_58;
  do {
    *(char *)((long)&local_cc + lVar16 + 3) = (char)uVar34;
    uVar34 = (ulong)(uint)((int)uVar34 >> 8);
    lVar16 = lVar16 + -1;
  } while (lVar16 != 0);
  lVar25 = 0;
  lVar16 = noutchar;
  do {
    if (lVar16 < lVar1) {
      local_d8[lVar16] = *(char *)((long)local_c8 + lVar25);
      lVar16 = lVar16 + 1;
      noutchar = lVar16;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 4);
  iVar26 = *local_e8;
  lVar16 = 8;
  do {
    *(char *)((long)&local_cc + lVar16 + 3) = (char)iVar26;
    iVar26 = iVar26 >> 8;
    lVar16 = lVar16 + -1;
  } while (lVar16 != 0);
  lVar25 = 0;
  lVar16 = noutchar;
  do {
    if (lVar16 < lVar1) {
      local_d8[lVar16] = *(char *)((long)local_c8 + lVar25);
      lVar16 = lVar16 + 1;
      noutchar = lVar16;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 8);
  *local_e8 = 0;
  iVar26 = uVar14 + 0xe;
  if (-1 < (int)(uVar14 + 7)) {
    iVar26 = uVar14 + 7;
  }
  __src = calloc(1,(long)(iVar26 >> 3));
  piVar3 = local_e8;
  if (__src == (void *)0x0) {
    err_message = "encode: insufficient memory";
  }
  else {
    if ((int)uVar14 < 1) {
      iVar26 = 8;
      uVar32 = 0;
    }
    else {
      uVar34 = 0;
      iVar26 = 8;
      uVar9 = 0;
      do {
        iVar29 = local_e8[uVar34];
        if (iVar29 < 1) {
          if (iVar29 < 0) {
            *(char *)((long)__src + uVar9) = *(char *)((long)__src + uVar9) * '\x02' + '\x01';
            iVar26 = iVar26 + -1;
            local_e8[uVar34] = -iVar29;
          }
        }
        else {
          *(char *)((long)__src + uVar9) = *(char *)((long)__src + uVar9) << 1;
          iVar26 = iVar26 + -1;
        }
        bVar35 = iVar26 == 0;
        if (bVar35) {
          iVar26 = 8;
        }
        uVar32 = (int)uVar9 + (uint)bVar35;
        uVar9 = (ulong)uVar32;
        uVar34 = uVar34 + 1;
      } while (uVar14 != uVar34);
    }
    if (iVar26 != 8) {
      *(char *)((long)__src + (long)(int)uVar32) =
           *(char *)((long)__src + (long)(int)uVar32) << ((byte)iVar26 & 0x1f);
      uVar32 = uVar32 + 1;
    }
    iVar29 = ((int)local_b0 - ((int)local_b0 + 1 >> 0x1f)) + 1 >> 1;
    iVar26 = (int)local_e0;
    iVar13 = (iVar26 - (iVar26 + 1 >> 0x1f)) + 1 >> 1;
    local_c8[2] = 0;
    local_c8[0] = 0;
    local_c8[1] = 0;
    if (0 < (int)uVar14) {
      uVar34 = 0;
      iVar15 = 0;
      iVar18 = 0;
      do {
        uVar20 = (uint)(iVar13 <= iVar18) + (uint)(iVar29 <= iVar15);
        uVar17 = local_e8[uVar34];
        if (local_e8[uVar34] < (int)local_c8[uVar20]) {
          uVar17 = local_c8[uVar20];
        }
        local_c8[uVar20] = uVar17;
        iVar19 = iVar18 + 1;
        iVar18 = iVar19;
        if (iVar26 <= iVar19) {
          iVar18 = 0;
        }
        iVar15 = iVar15 + (uint)(iVar26 <= iVar19);
        uVar34 = uVar34 + 1;
      } while (uVar14 != uVar34);
    }
    lVar16 = 0;
    do {
      uVar14 = local_c8[lVar16];
      cVar8 = '\0';
      uVar17 = uVar14;
      if (0 < (int)uVar14) {
        do {
          uVar14 = uVar17 >> 1;
          cVar8 = cVar8 + '\x01';
          bVar35 = 1 < uVar17;
          uVar17 = uVar14;
        } while (bVar35);
      }
      *(char *)((long)&local_eb + lVar16) = cVar8;
      local_c8[lVar16] = uVar14;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    lVar16 = noutchar;
    plVar28 = local_88;
    if (lVar1 < noutchar + 3) {
LAB_001c34ec:
      *plVar28 = lVar16;
    }
    else {
      local_d8[noutchar + 2] = local_e9;
      *(undefined2 *)(local_d8 + noutchar) = local_eb;
      buffer2 = 0;
      bits_to_go2 = 8;
      bitcount = 0;
      noutchar = noutchar + 3;
      iVar26 = qtree_encode(local_d8,local_e8,iVar26,iVar29,iVar13,(uint)(byte)local_eb);
      if (iVar26 == 0) {
        iVar26 = qtree_encode(local_d8,piVar3 + iVar13,(int)local_e0,iVar29,
                              (int)(((uint)(local_e0 >> 0x1f) & 1) + (int)local_e0) >> 1,
                              (uint)local_eb._1_1_);
      }
      if (iVar26 == 0) {
        iVar26 = qtree_encode(local_d8,piVar3 + iVar29 * (int)local_e0,(int)local_e0,
                              (int)(((uint)(local_b0 >> 0x1f) & 1) + (int)local_b0) >> 1,iVar13,
                              (uint)local_eb._1_1_);
      }
      if (iVar26 == 0) {
        iVar26 = (int)local_e0;
        iVar26 = qtree_encode(local_d8,piVar3 + (iVar29 * iVar26 + iVar13),iVar26,
                              (int)(((uint)(local_b0 >> 0x1f) & 1) + (int)local_b0) >> 1,
                              (int)(((uint)(local_e0 >> 0x1f) & 1) + iVar26) >> 1,(uint)local_e9);
      }
      output_nybble(local_d8,0);
      plVar28 = local_88;
      lVar1 = noutchar;
      lVar16 = (long)bits_to_go2;
      if (lVar16 < 8) {
        local_d8[noutchar] = (char)(buffer2 << ((byte)bits_to_go2 & 0x1f));
        if (lVar1 < noutmax) {
          noutchar = lVar1 + 1;
        }
        bitcount = bitcount + lVar16;
      }
      lVar16 = noutchar;
      if (0 < (int)uVar32) {
        lVar1 = (ulong)uVar32 + noutchar;
        if (noutmax < lVar1) {
          free(__src);
          goto LAB_001c34ec;
        }
        memcpy(local_d8 + noutchar,__src,(ulong)uVar32);
        noutchar = lVar1;
      }
      free(__src);
      lVar1 = noutchar;
      *plVar28 = noutchar;
      if (lVar1 < noutmax) goto LAB_001c3537;
    }
    err_message = "encode: output buffer too small";
  }
  ffpmsg(err_message);
  iVar26 = 0x19d;
LAB_001c3537:
  *status = iVar26;
  return iVar26;
}

Assistant:

int fits_hcompress(int *a, int ny, int nx, int scale, char *output, 
                  long *nbytes, int *status)
{
  /* 
     compress the input image using the H-compress algorithm
  
   a  - input image array
   nx - size of X axis of image
   ny - size of Y axis of image
   scale - quantization scale factor. Larger values results in more (lossy) compression
           scale = 0 does lossless compression
   output - pre-allocated array to hold the output compressed stream of bytes
   nbyts  - input value = size of the output buffer;
            returned value = size of the compressed byte stream, in bytes

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */

  int stat;
  
  if (*status > 0) return(*status);

  /* H-transform */
  stat = htrans(a, nx, ny);
  if (stat) {
     *status = stat;
     return(*status);
  }

  /* digitize */
  digitize(a, nx, ny, scale);

  /* encode and write to output array */

  FFLOCK;
  noutmax = *nbytes;  /* input value is the allocated size of the array */
  *nbytes = 0;  /* reset */

  stat = encode(output, nbytes, a, nx, ny, scale);
  FFUNLOCK;
  
  *status = stat;
  return(*status);
}